

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RendererParallelTests.cpp
# Opt level: O1

void __thiscall
agge::tests::mocks::thread_mapping_blender<unsigned_short,_unsigned_char>::operator()
          (thread_mapping_blender<unsigned_short,_unsigned_char> *this,unsigned_short *pixels,
          int param_2,int param_3,count_t length,cover_type *covers)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  mutex *this_01;
  pointer puVar1;
  iterator __position;
  uint uVar2;
  ulong uVar3;
  unsigned_long local_48;
  uint local_3c;
  thread_mapping_blender<unsigned_short,_unsigned_char> *local_38;
  
  local_38 = this;
  if (length != 0) {
    do {
      local_3c = (uint)*covers;
      this_00 = local_38->_mapping;
      this_01 = local_38->_mtx;
      local_48 = this_thread_id();
      mutex::lock(this_01);
      puVar1 = (this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      __position._M_current =
           (this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if ((long)__position._M_current - (long)puVar1 != 0) {
        uVar3 = 0;
        do {
          uVar2 = (uint)uVar3;
          if (local_48 == puVar1[uVar3]) goto LAB_00175018;
          uVar3 = (ulong)(byte)((char)uVar3 + 1);
        } while (uVar3 < (ulong)((long)__position._M_current - (long)puVar1 >> 3));
      }
      uVar2 = (uint)((ulong)((long)__position._M_current - (long)puVar1) >> 3) & 0x1fffffff;
      if (__position._M_current ==
          (this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert
                  (this_00,__position,&local_48);
      }
      else {
        *__position._M_current = local_48;
        (this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
LAB_00175018:
      mutex::unlock(this_01);
      *pixels = (ushort)local_3c | (ushort)((uVar2 & 0xff) << 8);
      pixels = pixels + 1;
      covers = covers + 1;
      length = length - 1;
    } while (length != 0);
  }
  return;
}

Assistant:

void operator ()(PixelT *pixels, int /*x*/, int /*y*/, count_t length, const cover_type *covers) const
				{
					for (; length; --length, ++pixels, ++covers)
						*pixels = static_cast<pixel>(static_cast<int>(*covers)
							+ (map_thread(_mapping, _mtx) << sizeof(cover_type) * 8));
				}